

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * P33xThread(void *pParam)

{
  int iVar1;
  int iVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  double temperature;
  double pressure;
  
  pressure = 0.0;
  temperature = 0.0;
  __mutex = P33xCS;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsP33x + lVar3 * 2) == pParam) {
      iVar2 = 0;
      do {
        mSleep((long)(*(int *)((long)pParam + 0x538) / 2));
        pressure = 0.0;
        iVar1 = GetPressureP33x((P33X *)pParam,&pressure);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        mSleep((long)(*(int *)((long)pParam + 0x538) / 2));
        temperature = 0.0;
        iVar1 = GetTemperatureP33x((P33X *)pParam,&temperature);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        *(double *)((long)pressureP33x + lVar3 * 2) = pressure;
        *(double *)((long)temperatureP33x + lVar3 * 2) = temperature;
        *(int *)((long)resP33x + lVar3) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitP33x + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X* pP33x = (P33X*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double pressure = 0, temperature = 0;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		mSleep(pP33x->threadperiod/2);
		pressure = 0;
		res = GetPressureP33x(pP33x, &pressure);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(pP33x->threadperiod/2);
		temperature = 0;
		res = GetTemperatureP33x(pP33x, &temperature);
		if (res != EXIT_SUCCESS) err = res;
		EnterCriticalSection(&P33xCS[id]);
		pressureP33x[id] = pressure;
		temperatureP33x[id] = temperature;
		resP33x[id] = err;
		LeaveCriticalSection(&P33xCS[id]);
		if (bExitP33x[id]) break;
	}

	return 0;
}